

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O2

void __thiscall
capnp::List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set
          (Builder *this,uint index,initializer_list<int> value)

{
  ulong uVar1;
  long lVar2;
  Builder l;
  Builder local_40;
  
  init(&local_40,(EVP_PKEY_CTX *)this);
  uVar1 = 0;
  for (lVar2 = value._M_len << 2; lVar2 != 0; lVar2 = lVar2 + -4) {
    *(int *)(local_40.builder.ptr + ((uVar1 & 0xffffffff) * (ulong)local_40.builder.step >> 3)) =
         value._M_array[uVar1];
    uVar1 = uVar1 + 1;
  }
  return;
}

Assistant:

void set(uint index, std::initializer_list<ReaderFor<T>> value) {
      KJ_IREQUIRE(index < size());
      auto l = init(index, value.size());
      uint i = 0;
      for (auto& element: value) {
        l.set(i++, element);
      }
    }